

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_IntegerReturnValue_Test::~TEST_MockReturnValueTest_IntegerReturnValue_Test
          (TEST_MockReturnValueTest_IntegerReturnValue_Test *this)

{
  TEST_MockReturnValueTest_IntegerReturnValue_Test *this_local;
  
  ~TEST_MockReturnValueTest_IntegerReturnValue_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockReturnValueTest, IntegerReturnValue)
{
    int expected_value = 1;
    mock().expectOneCall("foo").andReturnValue(1);
    MockActualCall& actual_call = mock().actualCall("foo");

    LONGS_EQUAL(expected_value, actual_call.returnValue().getIntValue());
    LONGS_EQUAL(expected_value, actual_call.returnIntValue());

    LONGS_EQUAL(expected_value, mock().returnValue().getIntValue());
    LONGS_EQUAL(expected_value, mock().intReturnValue());
}